

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void __thiscall re2::Regexp::Decref(Regexp *this)

{
  pthread_rwlock_t *__rwlock;
  _Rb_tree<re2::Regexp_*,_std::pair<re2::Regexp_*const,_int>,_std::_Select1st<std::pair<re2::Regexp_*const,_int>_>,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
  *this_00;
  uint16_t uVar1;
  int iVar2;
  Regexp *in_RAX;
  mapped_type *pmVar3;
  pair<std::_Rb_tree_iterator<std::pair<re2::Regexp_*const,_int>_>,_std::_Rb_tree_iterator<std::pair<re2::Regexp_*const,_int>_>_>
  pVar4;
  Regexp *local_28;
  
  __rwlock = ref_mutex;
  if (this->ref_ != 0xffff) {
    uVar1 = this->ref_ - 1;
    this->ref_ = uVar1;
    if (uVar1 != 0) {
      return;
    }
    Destroy(this);
    return;
  }
  local_28 = in_RAX;
  iVar2 = pthread_rwlock_wrlock(ref_mutex);
  if (iVar2 == 0) {
    local_28 = this;
    pmVar3 = std::
             map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
             ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                           *)ref_map,&local_28);
    iVar2 = *pmVar3 + -1;
    if (*pmVar3 < 0x10000) {
      this->ref_ = (uint16_t)iVar2;
      this_00 = ref_map;
      local_28 = this;
      pVar4 = std::
              _Rb_tree<re2::Regexp_*,_std::pair<re2::Regexp_*const,_int>,_std::_Select1st<std::pair<re2::Regexp_*const,_int>_>,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
              ::equal_range(ref_map,&local_28);
      std::
      _Rb_tree<re2::Regexp_*,_std::pair<re2::Regexp_*const,_int>,_std::_Select1st<std::pair<re2::Regexp_*const,_int>_>,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
      ::_M_erase_aux(this_00,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    }
    else {
      local_28 = this;
      pmVar3 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                             *)ref_map,&local_28);
      *pmVar3 = iVar2;
    }
    iVar2 = pthread_rwlock_unlock(__rwlock);
    if (iVar2 == 0) {
      return;
    }
  }
  abort();
}

Assistant:

void Regexp::Decref() {
  if (ref_ == kMaxRef) {
    // Ref count is stored in overflow map.
    MutexLock l(ref_mutex);
    int r = (*ref_map)[this] - 1;
    if (r < kMaxRef) {
      ref_ = static_cast<uint16_t>(r);
      ref_map->erase(this);
    } else {
      (*ref_map)[this] = r;
    }
    return;
  }
  ref_--;
  if (ref_ == 0)
    Destroy();
}